

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_long>,unsigned_long,duckdb::BitOrOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar2 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar1 = *(long *)(input + 0x28);
      uVar7 = 0;
      uVar3 = 0;
      do {
        if (lVar1 == 0) {
          uVar4 = uVar3 + 0x40;
          if (count <= uVar3 + 0x40) {
            uVar4 = count;
          }
LAB_004a7196:
          uVar10 = uVar3;
          if (uVar3 < uVar4) {
            bVar8 = *state;
            uVar9 = *(ulong *)(state + 8);
            do {
              uVar10 = *(ulong *)(lVar2 + uVar3 * 8);
              if ((bVar8 & 1) == 0) {
                *state = '\x01';
                bVar8 = 1;
              }
              else {
                uVar10 = uVar9 | uVar10;
              }
              uVar3 = uVar3 + 1;
              uVar9 = uVar10;
            } while (uVar4 != uVar3);
            *(ulong *)(state + 8) = uVar10;
            uVar10 = uVar4;
          }
        }
        else {
          uVar9 = *(ulong *)(lVar1 + uVar7 * 8);
          uVar4 = uVar3 + 0x40;
          if (count <= uVar3 + 0x40) {
            uVar4 = count;
          }
          if (uVar9 == 0xffffffffffffffff) goto LAB_004a7196;
          uVar10 = uVar4;
          if ((uVar9 != 0) && (uVar10 = uVar3, uVar3 < uVar4)) {
            uVar11 = 0;
            do {
              if ((uVar9 >> (uVar11 & 0x3f) & 1) != 0) {
                uVar10 = *(ulong *)(lVar2 + uVar3 * 8 + uVar11 * 8);
                if (*state == '\0') {
                  *(ulong *)(state + 8) = uVar10;
                  *state = '\x01';
                }
                else {
                  *(ulong *)(state + 8) = *(ulong *)(state + 8) | uVar10;
                }
              }
              uVar11 = uVar11 + 1;
              uVar10 = uVar4;
            } while (uVar4 - uVar3 != uVar11);
          }
        }
        uVar7 = uVar7 + 1;
        uVar3 = uVar10;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      uVar3 = **(ulong **)(input + 0x20);
      if (*state == '\0') {
        *state = '\x01';
      }
      else {
        uVar3 = uVar3 | *(ulong *)(state + 8);
      }
      *(ulong *)(state + 8) = uVar3;
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar2 = *local_68;
        bVar8 = *state;
        iVar5 = 0;
        uVar3 = *(ulong *)(state + 8);
        do {
          iVar6 = iVar5;
          if (lVar2 != 0) {
            iVar6 = (idx_t)*(uint *)(lVar2 + iVar5 * 4);
          }
          uVar7 = *(ulong *)(local_60 + iVar6 * 8);
          if ((bVar8 & 1) == 0) {
            *state = '\x01';
            bVar8 = 1;
          }
          else {
            uVar7 = uVar3 | uVar7;
          }
          iVar5 = iVar5 + 1;
          uVar3 = uVar7;
        } while (count != iVar5);
        *(ulong *)(state + 8) = uVar7;
      }
    }
    else if (count != 0) {
      lVar2 = *local_68;
      iVar5 = 0;
      do {
        iVar6 = iVar5;
        if (lVar2 != 0) {
          iVar6 = (idx_t)*(uint *)(lVar2 + iVar5 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0) {
          uVar3 = *(ulong *)(local_60 + iVar6 * 8);
          if (*state == '\0') {
            *(ulong *)(state + 8) = uVar3;
            *state = '\x01';
          }
          else {
            *(ulong *)(state + 8) = *(ulong *)(state + 8) | uVar3;
          }
        }
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}